

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon_net_linux.cpp
# Opt level: O2

int __thiscall DymonNet::connect(DymonNet *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  char *__cp;
  int iVar1;
  cJSON_bool cVar2;
  uint __fd_00;
  uint uVar3;
  cJSON *item;
  ulong uVar4;
  undefined4 in_register_00000034;
  uint __i;
  long lVar5;
  bool bVar6;
  timeval local_f0;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  sockaddr_in address;
  fd_set writeSet;
  
  if ((cJSON *)CONCAT44(in_register_00000034,__fd) != (cJSON *)0x0) {
    item = cJSON_GetObjectItemCaseSensitive((cJSON *)CONCAT44(in_register_00000034,__fd),"ip");
    cVar2 = cJSON_IsString(item);
    if (cVar2 != 0) {
      __cp = item->valuestring;
      __fd_00 = socket(2,1,6);
      if (-1 < (int)__fd_00) {
        uVar3 = fcntl(__fd_00,3,0);
        fcntl(__fd_00,4,(ulong)(uVar3 | 0x800));
        address.sin_addr.s_addr = inet_addr(__cp);
        address.sin_family = 2;
        address.sin_port = 0x8c23;
        ::connect(__fd_00,(sockaddr *)&address,0x10);
        fcntl(__fd_00,4,(ulong)uVar3);
        local_c8 = 0;
        local_d8 = 0;
        local_d0 = 5;
        local_e0 = 5;
        setsockopt(__fd_00,1,0x15,&local_d0,0x10);
        setsockopt(__fd_00,1,0x14,&local_e0,0x10);
        local_f0.tv_usec = 0;
        local_f0.tv_sec = 5;
        for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
          writeSet.fds_bits[lVar5] = 0;
        }
        uVar4 = 1L << ((byte)__fd_00 & 0x3f);
        writeSet.fds_bits[__fd_00 >> 6] = writeSet.fds_bits[__fd_00 >> 6] | uVar4;
        select(__fd_00 + 1,(fd_set *)0x0,(fd_set *)&writeSet,(fd_set *)0x0,&local_f0);
        bVar6 = (writeSet.fds_bits[__fd_00 >> 6] & uVar4) != 0;
        iVar1 = CONCAT31((uint3)(__fd_00 >> 0xe),bVar6);
        if (bVar6) {
          *(uint *)&(this->super_Dymon).field_0x34 = __fd_00;
          return iVar1;
        }
        ::close(__fd_00);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

bool DymonNet::connect(void * arg)
{
   if (arg == nullptr)
   {
      return false;
   }
   cJSON * ip = cJSON_GetObjectItemCaseSensitive((cJSON *)arg, "ip"); //get IP
   if (!cJSON_IsString(ip))
   {
      return false;
   }
   const char * printerIp = ip->valuestring;
   constexpr uint16_t port = 9100;

   //try to create socket
   int sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
   if (sock < 0)
   {
      return false;
   }

   //on success
   //set the socket to non-blocking
   int flags = fcntl(sock, F_GETFL, 0);
   fcntl(sock, F_SETFL, flags | O_NONBLOCK);

   //start connecting to host
   struct sockaddr_in address;  /* the libc network address data structure */
   uint32_t addr = inet_addr(printerIp); //convert string representation of IP address (decimals and dots) to binary
   address.sin_addr.s_addr = addr; /* assign the address */
   address.sin_port = htons(port);            /* translate int2port num */
   address.sin_family = AF_INET;
   ::connect(sock, (struct sockaddr *)&address, sizeof(address));

   //go back to blocking mode
   fcntl(sock, F_SETFL, flags);
   //configure send and receive timeouts
   struct timeval sendTimeout = { 0 };
   struct timeval recvTimeout = { 0 };
   sendTimeout.tv_sec = _SEND_RECV_TIMEOUT_1S;
   recvTimeout.tv_sec = _SEND_RECV_TIMEOUT_1S;
   setsockopt(sock, SOL_SOCKET, SO_SNDTIMEO, (char *)&sendTimeout, sizeof(struct timeval));
   setsockopt(sock, SOL_SOCKET, SO_RCVTIMEO, (char *)&recvTimeout, sizeof(struct timeval));

   //wait for connection, with timeout of 2 seconds
   struct timeval connectTimeout = { 0 };
   connectTimeout.tv_sec = _CONNECT_TIMEOUT_1SEC;
   fd_set writeSet;
   FD_ZERO(&writeSet);
   FD_SET(sock, &writeSet);

   // check if the socket is ready
   select(sock + 1, nullptr, &writeSet, nullptr, &connectTimeout);
   if (FD_ISSET(sock, &writeSet))
   {
      this->sockfd = (int)sock;
      return true;
   }

   //close socket in case of timeout
   ::close(sock);
   return false;

}